

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenModuleOptimize(BinaryenModuleRef module)

{
  undefined1 local_100 [8];
  PassRunner passRunner;
  BinaryenModuleRef module_local;
  
  passRunner._232_8_ = module;
  wasm::PassRunner::PassRunner((PassRunner *)local_100,module);
  wasm::PassOptions::operator=
            ((PassOptions *)
             &passRunner.passes.
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&globalPassOptions);
  wasm::PassRunner::addDefaultOptimizationPasses((PassRunner *)local_100);
  wasm::PassRunner::run((PassRunner *)local_100);
  wasm::PassRunner::~PassRunner((PassRunner *)local_100);
  return;
}

Assistant:

void BinaryenModuleOptimize(BinaryenModuleRef module) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  passRunner.addDefaultOptimizationPasses();
  passRunner.run();
}